

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O3

void __thiscall iDynTree::LinkPositions::LinkPositions(LinkPositions *this,Model *model)

{
  size_t nrOfLinks;
  
  (this->m_linkPos).super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_linkPos).super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_linkPos).super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrOfLinks = Model::getNrOfLinks(model);
  resize(this,nrOfLinks);
  return;
}

Assistant:

LinkPositions::LinkPositions(const Model& model)
{
    resize(model);
}